

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O0

void __thiscall blcl::net::connection<MsgType>::write_body(connection<MsgType> *this)

{
  message<MsgType> *pmVar1;
  uchar *data;
  size_type size_in_bytes;
  anon_class_8_1_8991fb9c_for_handler_ local_28;
  const_buffer local_20;
  connection<MsgType> *local_10;
  connection<MsgType> *this_local;
  
  local_10 = this;
  pmVar1 = tsqueue<blcl::net::message<MsgType>_>::front(&this->outgoing_messages_);
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pmVar1->body);
  pmVar1 = tsqueue<blcl::net::message<MsgType>_>::front(&this->outgoing_messages_);
  size_in_bytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pmVar1->body);
  local_20 = (const_buffer)asio::buffer(data,size_in_bytes);
  local_28.this = this;
  asio::
  async_write<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Swung0x48[P]SimpleRealTimeNetworking_NetCommon_net_connection_h:153:17)>
            (&this->socket_,(const_buffers_1 *)&local_20,&local_28,0);
  return;
}

Assistant:

void write_body() {
            asio::async_write(socket_, asio::buffer(outgoing_messages_.front().body.data(), outgoing_messages_.front().body.size()),
                [this](asio::error_code ec, std::size_t length) {
                    if (!ec) {
                        outgoing_messages_.pop_front();
                        if (!outgoing_messages_.empty())
                            write_header();
                    } else {
                        std::cout << "[WARN] " << id_ << ": Write body failed.\n";
                        std::cout << "[WARN] " << id_ << ": " << ec.message() << "\n";
                        socket_.close();
                    }
            });
        }